

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

int32_t adt_ary_indexOf(adt_ary_t *self,void *pElem)

{
  int local_24;
  int32_t s32Index;
  void *pElem_local;
  adt_ary_t *self_local;
  
  if (self != (adt_ary_t *)0x0) {
    for (local_24 = 0; local_24 < self->s32CurLen; local_24 = local_24 + 1) {
      if (self->pFirst[local_24] == pElem) {
        return local_24;
      }
    }
  }
  return -1;
}

Assistant:

int32_t adt_ary_indexOf(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem) {
            return s32Index;
         }
      }
   }
   return -1;
}